

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManVecNormal(float *pVec,int nDims)

{
  double dVar1;
  double local_20;
  double Norm;
  int i;
  int nDims_local;
  float *pVec_local;
  
  local_20 = 0.0;
  for (Norm._0_4_ = 0; Norm._0_4_ < nDims; Norm._0_4_ = Norm._0_4_ + 1) {
    local_20 = (double)(pVec[Norm._0_4_] * pVec[Norm._0_4_]) + local_20;
  }
  dVar1 = pow(local_20,0.5);
  for (Norm._0_4_ = 0; Norm._0_4_ < nDims; Norm._0_4_ = Norm._0_4_ + 1) {
    pVec[Norm._0_4_] = (float)((double)pVec[Norm._0_4_] / dVar1);
  }
  return;
}

Assistant:

void Emb_ManVecNormal( float * pVec, int nDims )
{
    int i;
    double Norm = 0.0;
    for ( i = 0; i < nDims; i++ )
        Norm += pVec[i] * pVec[i];
    Norm = pow( Norm, 0.5 );
    for ( i = 0; i < nDims; i++ )
        pVec[i] /= Norm;
}